

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  int iVar1;
  int local_40;
  int local_3c;
  int symbolsleft;
  int codebits;
  int j;
  int i;
  char maxlength_local;
  int numsymbols_local;
  uchar *lengths_local;
  huffman_code *code_local;
  archive_read *a_local;
  
  code->numentries = 0;
  code->numallocatedentries = 0;
  iVar1 = new_node(code);
  if (iVar1 < 0) {
    archive_set_error(&a->archive,0xc,"Unable to allocate memory for node data.");
    a_local._4_4_ = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    local_3c = 0;
    local_40 = numsymbols;
    for (codebits = 1; codebits <= maxlength; codebits = codebits + 1) {
      for (symbolsleft = 0; symbolsleft < numsymbols; symbolsleft = symbolsleft + 1) {
        if ((uint)lengths[symbolsleft] == codebits) {
          iVar1 = add_value(a,code,symbolsleft,local_3c,codebits);
          if (iVar1 != 0) {
            return -0x1e;
          }
          local_3c = local_3c + 1;
          local_40 = local_40 + -1;
          if (local_40 < 1) break;
        }
      }
      local_3c = local_3c << 1;
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  code->numentries = 0;
  code->numallocatedentries = 0;
  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0) { break; break; }
    }
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}